

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool __thiscall
Catch::RunContext::sectionStarted(RunContext *this,SectionInfo *sectionInfo,Counts *assertions)

{
  IStreamingReporter *pIVar1;
  size_t sVar2;
  int iVar3;
  ostream *poVar4;
  SectionTracker *pSVar5;
  ostringstream oss;
  string local_1c8;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar4 = std::operator<<((ostream *)local_1a8,(string *)&sectionInfo->name);
  poVar4 = std::operator<<(poVar4,"@");
  operator<<(poVar4,&sectionInfo->lineInfo);
  std::__cxx11::stringbuf::str();
  pSVar5 = TestCaseTracking::SectionTracker::acquire(&this->m_trackerContext,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  iVar3 = (*(pSVar5->super_TrackerBase).super_ITracker.super_SharedImpl<Catch::IShared>.
            super_IShared.super_NonCopyable._vptr_NonCopyable[7])(pSVar5);
  if (SUB41(iVar3,0) != false) {
    local_1c8._M_dataplus._M_p = (pointer)pSVar5;
    std::
    vector<Catch::TestCaseTracking::ITracker*,std::allocator<Catch::TestCaseTracking::ITracker*>>::
    emplace_back<Catch::TestCaseTracking::ITracker*>
              ((vector<Catch::TestCaseTracking::ITracker*,std::allocator<Catch::TestCaseTracking::ITracker*>>
                *)&this->m_activeSections,(ITracker **)&local_1c8);
    SourceLineInfo::operator=(&(this->m_lastAssertionInfo).lineInfo,&sectionInfo->lineInfo);
    pIVar1 = (this->m_reporter).m_p;
    (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[9])(pIVar1,sectionInfo);
    assertions->failedButOk = (this->m_totals).assertions.failedButOk;
    sVar2 = (this->m_totals).assertions.failed;
    assertions->passed = (this->m_totals).assertions.passed;
    assertions->failed = sVar2;
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return SUB41(iVar3,0);
}

Assistant:

virtual bool sectionStarted
            (   SectionInfo const& sectionInfo,
                Counts& assertions ) CATCH_OVERRIDE
        {
            std::ostringstream oss;
            oss << sectionInfo.name << "@" << sectionInfo.lineInfo;

            ITracker& sectionTracker = SectionTracker::acquire( m_trackerContext, oss.str() );
            if( !sectionTracker.isOpen() )
                return false;
            m_activeSections.push_back( &sectionTracker );

            m_lastAssertionInfo.lineInfo = sectionInfo.lineInfo;

            m_reporter->sectionStarting( sectionInfo );

            assertions = m_totals.assertions;

            return true;
        }